

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::on_actionTest_MIDI_Driver_toggled(MainWindow *this,bool checked)

{
  TestMidiDriver *this_00;
  bool bVar1;
  bool running;
  bool checked_local;
  MainWindow *this_local;
  
  bVar1 = this->testMidiDriver != (MidiDriver *)0x0;
  if (bVar1 != checked) {
    if (bVar1) {
      (**(code **)(*(long *)this->testMidiDriver + 0x70))();
      if (this->testMidiDriver != (MidiDriver *)0x0) {
        (**(code **)(*(long *)this->testMidiDriver + 0x20))();
      }
      this->testMidiDriver = (MidiDriver *)0x0;
    }
    else {
      this_00 = (TestMidiDriver *)operator_new(0x68);
      TestMidiDriver::TestMidiDriver(this_00,this->master);
      this->testMidiDriver = (MidiDriver *)this_00;
      (**(code **)(*(long *)this->testMidiDriver + 0x68))();
    }
  }
  return;
}

Assistant:

void MainWindow::on_actionTest_MIDI_Driver_toggled(bool checked) {
	bool running = testMidiDriver != NULL;
	if (running != checked) {
		if (running) {
			testMidiDriver->stop();
			delete testMidiDriver;
			testMidiDriver = NULL;
		} else {
			testMidiDriver = new TestMidiDriver(master);
			testMidiDriver->start();
		}
	}
}